

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestResult.cpp
# Opt level: O2

void __thiscall CppUnit::TestResult::endTestRun(TestResult *this,Test *test)

{
  _Map_pointer pppTVar1;
  _Elt_pointer ppTVar2;
  _Elt_pointer ppTVar3;
  ExclusiveZone local_38;
  ExclusiveZone zone;
  
  local_38.m_syncObject = (this->super_SynchronizedObject).m_syncObject;
  (*(local_38.m_syncObject)->_vptr_SynchronizationObject[2])();
  ppTVar3 = (this->m_listeners).
            super__Deque_base<CppUnit::TestListener_*,_std::allocator<CppUnit::TestListener_*>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur;
  ppTVar2 = (this->m_listeners).
            super__Deque_base<CppUnit::TestListener_*,_std::allocator<CppUnit::TestListener_*>_>.
            _M_impl.super__Deque_impl_data._M_start._M_last;
  pppTVar1 = (this->m_listeners).
             super__Deque_base<CppUnit::TestListener_*,_std::allocator<CppUnit::TestListener_*>_>.
             _M_impl.super__Deque_impl_data._M_start._M_node;
  while (ppTVar3 !=
         (this->m_listeners).
         super__Deque_base<CppUnit::TestListener_*,_std::allocator<CppUnit::TestListener_*>_>.
         _M_impl.super__Deque_impl_data._M_finish._M_cur) {
    (*(*ppTVar3)->_vptr_TestListener[8])(*ppTVar3,test,this);
    ppTVar3 = ppTVar3 + 1;
    if (ppTVar3 == ppTVar2) {
      ppTVar3 = pppTVar1[1];
      pppTVar1 = pppTVar1 + 1;
      ppTVar2 = ppTVar3 + 0x40;
    }
  }
  SynchronizedObject::ExclusiveZone::~ExclusiveZone(&local_38);
  return;
}

Assistant:

void 
TestResult::endTestRun( Test *test )
{
  ExclusiveZone zone( m_syncObject ); 
  for ( TestListeners::iterator it = m_listeners.begin();
        it != m_listeners.end(); 
        ++it )
    (*it)->endTestRun( test, this );
}